

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ParenPragmaExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ParenPragmaExpressionSyntax,slang::syntax::ParenPragmaExpressionSyntax_const&>
          (BumpAllocator *this,ParenPragmaExpressionSyntax *args)

{
  SyntaxNode *pSVar1;
  Info *pIVar2;
  size_t sVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  ParenPragmaExpressionSyntax *pPVar8;
  
  pPVar8 = (ParenPragmaExpressionSyntax *)allocate(this,0x70,8);
  (pPVar8->super_PragmaExpressionSyntax).super_SyntaxNode.previewNode =
       (args->super_PragmaExpressionSyntax).super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->super_PragmaExpressionSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_PragmaExpressionSyntax).super_SyntaxNode.parent;
  (pPVar8->super_PragmaExpressionSyntax).super_SyntaxNode.kind =
       (args->super_PragmaExpressionSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pPVar8->super_PragmaExpressionSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pPVar8->super_PragmaExpressionSyntax).super_SyntaxNode.parent = pSVar1;
  uVar5 = (args->openParen).field_0x2;
  NVar6.raw = (args->openParen).numFlags.raw;
  uVar7 = (args->openParen).rawLen;
  pIVar2 = (args->openParen).info;
  (pPVar8->openParen).kind = (args->openParen).kind;
  (pPVar8->openParen).field_0x2 = uVar5;
  (pPVar8->openParen).numFlags = (NumericTokenFlags)NVar6.raw;
  (pPVar8->openParen).rawLen = uVar7;
  (pPVar8->openParen).info = pIVar2;
  (pPVar8->values).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->values).super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->values).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->values).super_SyntaxListBase.super_SyntaxNode.parent;
  (pPVar8->values).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->values).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pPVar8->values).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pPVar8->values).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pPVar8->values).super_SyntaxListBase.childCount = (args->values).super_SyntaxListBase.childCount;
  (pPVar8->values).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002db800;
  sVar3 = (args->values).elements._M_extent._M_extent_value;
  (pPVar8->values).elements._M_ptr = (args->values).elements._M_ptr;
  (pPVar8->values).elements._M_extent._M_extent_value = sVar3;
  uVar5 = (args->closeParen).field_0x2;
  NVar6.raw = (args->closeParen).numFlags.raw;
  uVar7 = (args->closeParen).rawLen;
  pIVar2 = (args->closeParen).info;
  (pPVar8->closeParen).kind = (args->closeParen).kind;
  (pPVar8->closeParen).field_0x2 = uVar5;
  (pPVar8->closeParen).numFlags = (NumericTokenFlags)NVar6.raw;
  (pPVar8->closeParen).rawLen = uVar7;
  (pPVar8->closeParen).info = pIVar2;
  return pPVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }